

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O1

void __thiscall
QAbstractFileEngineIterator::QAbstractFileEngineIterator
          (QAbstractFileEngineIterator *this,QString *path,Filters filters,QStringList *nameFilters)

{
  Data *pDVar1;
  
  this->_vptr_QAbstractFileEngineIterator = (_func_int **)&PTR__QAbstractFileEngineIterator_006a7338
  ;
  QFileInfo::QFileInfo(&this->m_fileInfo);
  (this->m_filters).super_QFlagsStorageHelper<QDir::Filter,_4>.super_QFlagsStorage<QDir::Filter>.i =
       (Int)filters.super_QFlagsStorageHelper<QDir::Filter,_4>.super_QFlagsStorage<QDir::Filter>.i;
  (this->m_listingFilters).super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
  super_QFlagsStorage<QDirListing::IteratorFlag>.i = 0;
  pDVar1 = (nameFilters->d).d;
  (this->m_nameFilters).d.d = pDVar1;
  (this->m_nameFilters).d.ptr = (nameFilters->d).ptr;
  (this->m_nameFilters).d.size = (nameFilters->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  appendSlashIfNeeded(&this->m_path,path);
  return;
}

Assistant:

QAbstractFileEngineIterator::QAbstractFileEngineIterator(const QString &path, QDir::Filters filters,
                                                         const QStringList &nameFilters)
    : m_filters(filters),
      m_nameFilters(nameFilters),
      m_path(appendSlashIfNeeded(path))
{
}